

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BVHAggregate::Intersect(BVHAggregate *this,Ray *ray,Float tMax)

{
  undefined1 uVar1;
  bool bVar2;
  long lVar3;
  ShapeIntersection *pSVar4;
  long lVar5;
  Ray *in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  long *in_FS_OFFSET;
  Float in_XMM0_Da;
  optional<pbrt::ShapeIntersection> primSi;
  int i;
  LinearBVHNode *node;
  int nodesVisited;
  int nodesToVisit [64];
  int currentNodeIndex;
  int toVisitOffset;
  int dirIsNeg [3];
  Vector3f invDir;
  optional<pbrt::ShapeIntersection> *si;
  float in_stack_fffffffffffffd58;
  float in_stack_fffffffffffffd5c;
  Vector3<float> *in_stack_fffffffffffffd60;
  undefined6 in_stack_fffffffffffffd68;
  optional<pbrt::ShapeIntersection> *poVar6;
  Vector3f *in_stack_fffffffffffffd88;
  Float in_stack_fffffffffffffd94;
  Vector3f *in_stack_fffffffffffffd98;
  Point3f *in_stack_fffffffffffffda0;
  Bounds3<float> *in_stack_fffffffffffffda8;
  int local_16c;
  int local_15c;
  int aiStack_158 [66];
  int local_50;
  int local_4c;
  uint local_48 [7];
  float local_2c;
  float local_28;
  float local_24;
  undefined1 local_1d;
  Float local_1c;
  
  lVar3._0_4_ = in_RSI[1].o.super_Tuple3<pbrt::Point3,_float>.x;
  lVar3._4_4_ = in_RSI[1].o.super_Tuple3<pbrt::Point3,_float>.y;
  poVar6 = in_RDI;
  if (lVar3 == 0) {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  else {
    local_1d = 0;
    local_1c = in_XMM0_Da;
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
    Vector3<float>::Vector3
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58,0.0);
    local_48[0] = (uint)(local_2c < 0.0);
    local_48[1] = (uint)(local_28 < 0.0);
    local_48[2] = (uint)(local_24 < 0.0);
    local_4c = 0;
    local_50 = 0;
    local_15c = 0;
    while( true ) {
      while( true ) {
        local_15c = local_15c + 1;
        lVar3 = *(long *)&in_RSI[1].o.super_Tuple3<pbrt::Point3,_float> + (long)local_50 * 0x20;
        uVar1 = Bounds3<float>::IntersectP
                          (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                           in_stack_fffffffffffffd88,(int *)in_RSI);
        if (!(bool)uVar1) break;
        if (*(short *)(lVar3 + 0x1c) == 0) {
          if (local_48[*(byte *)(lVar3 + 0x1e)] == 0) {
            lVar5 = (long)local_4c;
            local_4c = local_4c + 1;
            aiStack_158[lVar5] = *(int *)(lVar3 + 0x18);
            local_50 = local_50 + 1;
          }
          else {
            lVar5 = (long)local_4c;
            local_4c = local_4c + 1;
            aiStack_158[lVar5] = local_50 + 1;
            local_50 = *(int *)(lVar3 + 0x18);
          }
        }
        else {
          for (local_16c = 0; local_16c < (int)(uint)*(ushort *)(lVar3 + 0x1c);
              local_16c = local_16c + 1) {
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       &(in_RSI->o).super_Tuple3<pbrt::Point3,_float>.z,
                       (long)(*(int *)(lVar3 + 0x18) + local_16c));
            PrimitiveHandle::Intersect
                      ((PrimitiveHandle *)in_stack_fffffffffffffd88,in_RSI,
                       (Float)((ulong)poVar6 >> 0x20));
            bVar2 = pstd::optional::operator_cast_to_bool((optional *)&stack0xfffffffffffffd88);
            if (bVar2) {
              pstd::optional<pbrt::ShapeIntersection>::operator=
                        (in_RDI,(optional<pbrt::ShapeIntersection> *)
                                CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffd68)));
              pSVar4 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                 ((optional<pbrt::ShapeIntersection> *)0x7776b9);
              local_1c = pSVar4->tHit;
            }
            pstd::optional<pbrt::ShapeIntersection>::~optional
                      ((optional<pbrt::ShapeIntersection> *)0x77771e);
          }
          if (local_4c == 0) goto LAB_00777827;
          local_4c = local_4c + -1;
          local_50 = aiStack_158[local_4c];
        }
      }
      if (local_4c == 0) break;
      local_4c = local_4c + -1;
      local_50 = aiStack_158[local_4c];
    }
LAB_00777827:
    *(long *)(*in_FS_OFFSET + -0x350) = (long)local_15c + *(long *)(*in_FS_OFFSET + -0x350);
  }
  return poVar6;
}

Assistant:

pstd::optional<ShapeIntersection> BVHAggregate::Intersect(const Ray &ray,
                                                          Float tMax) const {
    if (nodes == nullptr)
        return {};
    pstd::optional<ShapeIntersection> si;
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int dirIsNeg[3] = {int(invDir.x < 0), int(invDir.y < 0), int(invDir.z < 0)};
    // Follow ray through BVH nodes to find primitive intersections
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesToVisit[64];
    int nodesVisited = 0;
    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        // Check ray against BVH node
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            if (node->nPrimitives > 0) {
                // Intersect ray with primitives in leaf BVH node
                for (int i = 0; i < node->nPrimitives; ++i) {
                    pstd::optional<ShapeIntersection> primSi =
                        primitives[node->primitivesOffset + i].Intersect(ray, tMax);
                    if (primSi) {
                        si = primSi;
                        tMax = si->tHit;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];

            } else {
                // Put far BVH node on _nodesToVisit_ stack, advance to near node
                if (dirIsNeg[node->axis]) {
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }

    bvhNodesVisited += nodesVisited;
    return si;
}